

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleCharFinder.hpp
# Opt level: O0

void __thiscall
peach::fsm::SingleCharFinder::SingleCharFinder
          (SingleCharFinder *this,
          vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
          *chars)

{
  bool bVar1;
  reference __in;
  element_type *peVar2;
  Node local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  shared_ptr<peach::fsm::Node> charNode;
  type *category;
  type *ch;
  __normal_iterator<const_std::pair<char,_unsigned_long>_*,_std::vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>_>
  local_30;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_> *__range2
  ;
  vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
  *chars_local;
  SingleCharFinder *this_local;
  
  FiniteStateMachine::FiniteStateMachine(&this->super_FiniteStateMachine);
  __end2 = std::
           vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
           ::begin(chars);
  local_30._M_current =
       (pair<char,_unsigned_long> *)
       std::vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
       ::end(chars);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&local_30);
    if (!bVar1) break;
    __in = __gnu_cxx::
           __normal_iterator<const_std::pair<char,_unsigned_long>_*,_std::vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>_>
           ::operator*(&__end2);
    std::get<0ul,char,unsigned_long>(__in);
    charNode.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::get<1ul,char,unsigned_long>(__in);
    FiniteStateMachine::getRoot((FiniteStateMachine *)local_68);
    peVar2 = std::__shared_ptr_access<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
    Node::addTransitionToNewNode<peach::transition::SingleCharTransition,char_const&>
              ((Node *)local_58,(tokenCategory_t)peVar2,(char *)0x0);
    std::shared_ptr<peach::fsm::Node>::~shared_ptr((shared_ptr<peach::fsm::Node> *)local_68);
    peVar2 = std::__shared_ptr_access<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_58);
    Node::addTransitionToNewNode<peach::transition::TrueTransition>
              (&local_88,(tokenCategory_t)peVar2);
    std::shared_ptr<peach::fsm::Node>::~shared_ptr((shared_ptr<peach::fsm::Node> *)&local_88);
    std::shared_ptr<peach::fsm::Node>::~shared_ptr((shared_ptr<peach::fsm::Node> *)local_58);
    __gnu_cxx::
    __normal_iterator<const_std::pair<char,_unsigned_long>_*,_std::vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

SingleCharFinder(const std::vector<std::pair<char, token::tokenCategory_t>> &chars)
    {
        for (const auto &[ch, category] : chars)
        {
            auto charNode = getRoot()->addTransitionToNewNode<transition::SingleCharTransition>(token::tokenCategory::UNDEFINED, ch);
            charNode->addTransitionToNewNode<transition::TrueTransition>(category);
        }
    }